

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,FileDescriptorProto *file,
          pair<const_void_*,_int> value)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  LogMessage *pLVar4;
  Type *pTVar5;
  Type *pTVar6;
  Type *pTVar7;
  Type *pTVar8;
  int iVar9;
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  pair<const_void_*,_int> value_02;
  pair<const_void_*,_int> value_03;
  pair<const_void_*,_int> value_04;
  pair<const_void_*,_int> value_05;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  second_type local_78;
  undefined1 local_68 [56];
  
  local_78.first = value.first;
  local_78.second = value.second;
  bVar3 = InsertIfNotPresent<std::map<std::__cxx11::string,std::pair<void_const*,int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<void_const*,int>>>>>
                    (&this->by_name_,(file->name_).ptr_,&local_78);
  if (!bVar3) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x39);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)local_68,"File already exists in database: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,(file->name_).ptr_);
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
    return false;
  }
  if (((file->_has_bits_).has_bits_[0] & 2) == 0) {
    local_68._0_8_ = local_68 + 0x10;
    local_68._8_8_ = (char *)0x0;
    local_68[0x10] = '\0';
  }
  else {
    psVar1 = (file->package_).ptr_;
    local_68._0_8_ = local_68 + 0x10;
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar2,pcVar2 + psVar1->_M_string_length);
    if ((char *)local_68._8_8_ != (char *)0x0) {
      std::__cxx11::string::push_back((char)local_68);
    }
  }
  if (0 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar9 = 0;
    do {
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(file->message_type_).super_RepeatedPtrFieldBase,iVar9);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (pTVar5->name_).ptr_);
      value_00.second = local_78.second;
      value_00.first = local_78.first;
      value_00._12_4_ = 0;
      bVar3 = AddSymbol(this,&local_98,value_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) goto LAB_005a0c70;
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(file->message_type_).super_RepeatedPtrFieldBase,iVar9);
      value_01.second = local_78.second;
      value_01.first = local_78.first;
      value_01._12_4_ = 0;
      bVar3 = AddNestedExtensions(this,pTVar5,value_01);
      if (!bVar3) goto LAB_005a0c70;
      iVar9 = iVar9 + 1;
    } while (iVar9 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar9 = 0;
    do {
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(file->enum_type_).super_RepeatedPtrFieldBase,iVar9);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (pTVar6->name_).ptr_);
      value_02.second = local_78.second;
      value_02.first = local_78.first;
      value_02._12_4_ = 0;
      bVar3 = AddSymbol(this,&local_98,value_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) goto LAB_005a0c70;
      iVar9 = iVar9 + 1;
    } while (iVar9 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->extension_).super_RepeatedPtrFieldBase.current_size_) {
    iVar9 = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(file->extension_).super_RepeatedPtrFieldBase,iVar9);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (pTVar7->name_).ptr_);
      value_03.second = local_78.second;
      value_03.first = local_78.first;
      value_03._12_4_ = 0;
      bVar3 = AddSymbol(this,&local_98,value_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) goto LAB_005a0c70;
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(file->extension_).super_RepeatedPtrFieldBase,iVar9);
      value_04.second = local_78.second;
      value_04.first = local_78.first;
      value_04._12_4_ = 0;
      bVar3 = AddExtension(this,pTVar7,value_04);
      if (!bVar3) goto LAB_005a0c70;
      iVar9 = iVar9 + 1;
    } while (iVar9 < (file->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((file->service_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    bVar3 = true;
  }
  else {
    iVar9 = 0;
    do {
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                         (&(file->service_).super_RepeatedPtrFieldBase,iVar9);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (pTVar8->name_).ptr_);
      value_05.second = local_78.second;
      value_05.first = local_78.first;
      value_05._12_4_ = 0;
      bVar3 = AddSymbol(this,&local_98,value_05);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    } while ((bVar3) &&
            (iVar9 = iVar9 + 1, iVar9 < (file->service_).super_RepeatedPtrFieldBase.current_size_));
  }
LAB_005a0c72:
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
  }
  return bVar3;
LAB_005a0c70:
  bVar3 = false;
  goto LAB_005a0c72;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file,
    Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  string path = file.has_package() ? file.package() : string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.message_type(i), value)) return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}